

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseNestedFlatbuffer
          (Parser *this,Value *val,FieldDef *field,size_t fieldn,StructDef *parent_struct_def)

{
  char **ppcVar1;
  StructDef *pSVar2;
  size_type sVar3;
  bool bVar4;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> t;
  char *__dest;
  uint8_t *v;
  CheckedError *ce;
  size_t in_R9;
  uint16_t *this_00;
  string substring;
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab0 [48];
  Parser nested_parser;
  
  if (*(int *)&(val->type).field_0x1c == 0x5b) {
    if (*(char *)((long)&val[0x16].type.enum_def + 3) != '\x01') {
      ppcVar1 = &nested_parser.super_ParserState.line_start_;
      __dnew = 0x49;
      nested_parser.super_ParserState.prev_cursor_ = (char *)ppcVar1;
      __dest = (char *)std::__cxx11::string::_M_create((ulong *)&nested_parser,(ulong)&__dnew);
      sVar3 = __dnew;
      nested_parser.super_ParserState.line_start_ = (char *)__dnew;
      nested_parser.super_ParserState.prev_cursor_ = __dest;
      memcpy(__dest,"cannot parse nested_flatbuffer as bytes unless --json-nested-bytes is set",0x49
            );
      nested_parser.super_ParserState.cursor_ = (char *)sVar3;
      __dest[sVar3] = '\0';
      Error(this,(string *)val);
      if ((char **)nested_parser.super_ParserState.prev_cursor_ != ppcVar1) {
        operator_delete(nested_parser.super_ParserState.prev_cursor_,
                        (ulong)(nested_parser.super_ParserState.line_start_ + 1));
      }
      goto LAB_001181f1;
    }
    ParseAnyValue(this,val,field,fieldn,parent_struct_def,in_R9,false);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001181f1;
  }
  else {
    pSVar2 = (val->type).struct_def;
    SkipAnyJsonValue(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_001181f1;
    substring._M_dataplus._M_p = (pointer)&substring.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&substring,
               (undefined1 *)
               ((long)&pSVar2[-1].reserved_ids.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7),
               (undefined1 *)
               ((long)&(val->type).struct_def[-1].reserved_ids.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    IDLOptions::IDLOptions((IDLOptions *)&__dnew);
    Parser(&nested_parser,(IDLOptions *)&__dnew);
    IDLOptions::~IDLOptions((IDLOptions *)&__dnew);
    nested_parser.root_struct_def_ = *(StructDef **)(fieldn + 0x120);
    if (nested_parser.root_struct_def_ == (StructDef *)0x0) {
      __assert_fail("field->nested_flatbuffer",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0x75e,
                    "CheckedError flatbuffers::Parser::ParseNestedFlatbuffer(Value &, FieldDef *, size_t, const StructDef *)"
                   );
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                 *)&nested_parser.enums_,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                 *)&val[3].type.fixed_length);
    std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::operator=
              (&nested_parser.enums_.vec,
               (vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *)(val + 4))
    ;
    IDLOptions::operator=(&nested_parser.opts,(IDLOptions *)&val[0xd].offset);
    nested_parser.uses_flexbuffers_ = (bool)val[0x18].constant.field_2._M_local_buf[8];
    nested_parser.parse_depth_counter_ = *(int *)((long)&val[0x1a].constant._M_string_length + 4);
    bVar4 = Parse(&nested_parser,substring._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
             *)&nested_parser.enums_);
    if (nested_parser.enums_.vec.
        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        nested_parser.enums_.vec.
        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      nested_parser.enums_.vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           nested_parser.enums_.vec.
           super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (bVar4) {
LAB_00118131:
      if (nested_parser.builder_.finished == false) {
        __assert_fail("finished",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                      ,0x10b,
                      "void flatbuffers::FlatBufferBuilderImpl<>::Finished() const [Is64Aware = false]"
                     );
      }
      this_00 = &val[6].type.fixed_length;
      FlatBufferBuilderImpl<false>::ForceVectorAlignment
                ((FlatBufferBuilderImpl<false> *)this_00,(ulong)nested_parser.builder_.buf_.size_,1,
                 nested_parser.builder_.minalign_);
      v = FlatBufferBuilderImpl<false>::GetBufferPointer(&nested_parser.builder_);
      t = FlatBufferBuilderImpl<false>::
          CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                    ((FlatBufferBuilderImpl<false> *)this_00,v,
                     (ulong)nested_parser.builder_.buf_.size_);
      NumToString<unsigned_int>((string *)&__dnew,t.o);
      std::__cxx11::string::operator=((string *)&(field->super_Definition).file,(string *)&__dnew);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew != local_ab0) {
        operator_delete((void *)__dnew,local_ab0[0]._M_allocated_capacity + 1);
      }
      bVar4 = true;
    }
    else {
      Error(this,(string *)val);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_00118131;
      bVar4 = false;
    }
    ~Parser(&nested_parser);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)substring._M_dataplus._M_p != &substring.field_2) {
      operator_delete(substring._M_dataplus._M_p,substring.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) goto LAB_001181f1;
  }
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_001181f1:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseNestedFlatbuffer(Value &val, FieldDef *field,
                                           size_t fieldn,
                                           const StructDef *parent_struct_def) {
  if (token_ == '[') {  // backwards compat for 'legacy' ubyte buffers
    if (opts.json_nested_legacy_flatbuffers) {
      ECHECK(ParseAnyValue(val, field, fieldn, parent_struct_def, 0));
    } else {
      return Error(
          "cannot parse nested_flatbuffer as bytes unless"
          " --json-nested-bytes is set");
    }
  } else {
    auto cursor_at_value_begin = cursor_;
    ECHECK(SkipAnyJsonValue());
    std::string substring(cursor_at_value_begin - 1, cursor_ - 1);

    // Create and initialize new parser
    Parser nested_parser;
    FLATBUFFERS_ASSERT(field->nested_flatbuffer);
    nested_parser.root_struct_def_ = field->nested_flatbuffer;
    nested_parser.enums_ = enums_;
    nested_parser.opts = opts;
    nested_parser.uses_flexbuffers_ = uses_flexbuffers_;
    nested_parser.parse_depth_counter_ = parse_depth_counter_;
    // Parse JSON substring into new flatbuffer builder using nested_parser
    bool ok = nested_parser.Parse(substring.c_str(), nullptr, nullptr);

    // Clean nested_parser to avoid deleting the elements in
    // the SymbolTables on destruction
    nested_parser.enums_.dict.clear();
    nested_parser.enums_.vec.clear();

    if (!ok) { ECHECK(Error(nested_parser.error_)); }
    // Force alignment for nested flatbuffer
    builder_.ForceVectorAlignment(
        nested_parser.builder_.GetSize(), sizeof(uint8_t),
        nested_parser.builder_.GetBufferMinAlignment());

    auto off = builder_.CreateVector(nested_parser.builder_.GetBufferPointer(),
                                     nested_parser.builder_.GetSize());
    val.constant = NumToString(off.o);
  }
  return NoError();
}